

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QStatusBarPrivate::SBItem>::erase
          (QMovableArrayOps<QStatusBarPrivate::SBItem> *this,SBItem *b,qsizetype n)

{
  SBItem *pSVar1;
  long lVar2;
  SBItem *pSVar3;
  SBItem *__src;
  
  __src = b + n;
  pSVar1 = (this->super_QGenericArrayOps<QStatusBarPrivate::SBItem>).
           super_QArrayDataPointer<QStatusBarPrivate::SBItem>.ptr;
  lVar2 = (this->super_QGenericArrayOps<QStatusBarPrivate::SBItem>).
          super_QArrayDataPointer<QStatusBarPrivate::SBItem>.size;
  pSVar3 = pSVar1 + lVar2;
  if (__src == pSVar3 || pSVar1 != b) {
    if (__src != pSVar3) {
      memmove(b,__src,(long)pSVar3 - (long)__src);
      lVar2 = (this->super_QGenericArrayOps<QStatusBarPrivate::SBItem>).
              super_QArrayDataPointer<QStatusBarPrivate::SBItem>.size;
    }
  }
  else {
    (this->super_QGenericArrayOps<QStatusBarPrivate::SBItem>).
    super_QArrayDataPointer<QStatusBarPrivate::SBItem>.ptr = __src;
  }
  (this->super_QGenericArrayOps<QStatusBarPrivate::SBItem>).
  super_QArrayDataPointer<QStatusBarPrivate::SBItem>.size = lVar2 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }